

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::send_final_block(lzcompressor *this)

{
  bool bVar1;
  symbol_codec *in_RDI;
  lzcompressor *in_stack_ffffffffffffffd8;
  vector<unsigned_char> *in_stack_ffffffffffffffe0;
  vector<unsigned_char> *this_00;
  bool local_1;
  
  bVar1 = symbol_codec::start_encoding(in_RDI,(uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (bVar1) {
    if ((*(int *)&in_RDI[0x56].m_pDecode_buf_next != 0) ||
       (bVar1 = send_configuration(in_stack_ffffffffffffffd8), bVar1)) {
      bVar1 = symbol_codec::encode_bits
                        (in_RDI,(uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                         (uint)in_stack_ffffffffffffffe0);
      if (bVar1) {
        bVar1 = symbol_codec::encode_align_to_byte((symbol_codec *)in_stack_ffffffffffffffd8);
        if (bVar1) {
          bVar1 = symbol_codec::encode_bits
                            (in_RDI,(uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                             (uint)in_stack_ffffffffffffffe0);
          if (bVar1) {
            bVar1 = symbol_codec::stop_encoding
                              (in_RDI,SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0));
            if (bVar1) {
              bVar1 = vector<unsigned_char>::empty
                                ((vector<unsigned_char> *)&in_RDI[0x55].m_pSaved_bit_model);
              if (bVar1) {
                this_00 = (vector<unsigned_char> *)&in_RDI[0x55].m_pSaved_bit_model;
                symbol_codec::get_encoding_buf
                          ((symbol_codec *)&in_RDI[0x25].m_arith_output_buf.m_size);
                vector<unsigned_char>::swap
                          (this_00,(vector<unsigned_char> *)in_stack_ffffffffffffffd8);
              }
              else {
                symbol_codec::get_encoding_buf
                          ((symbol_codec *)&in_RDI[0x25].m_arith_output_buf.m_size);
                bVar1 = vector<unsigned_char>::append
                                  ((vector<unsigned_char> *)in_RDI,in_stack_ffffffffffffffe0);
                if (!bVar1) {
                  return false;
                }
              }
              *(int *)&in_RDI[0x56].m_pDecode_buf_next =
                   *(int *)&in_RDI[0x56].m_pDecode_buf_next + 1;
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzcompressor::send_final_block()
   {
      //m_codec.clear();

      if (!m_codec.start_encoding(16))
         return false;

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(166, 12))
         return false;
#endif

      if (!m_block_index)
      {
         if (!send_configuration())
            return false;
      }

      if (!m_codec.encode_bits(cEOFBlock, cBlockHeaderBits))
         return false;

      if (!m_codec.encode_align_to_byte())
         return false;

      if (!m_codec.encode_bits(m_src_adler32, 32))
         return false;

      if (!m_codec.stop_encoding(true))
         return false;

      if (m_comp_buf.empty())
      {
         m_comp_buf.swap(m_codec.get_encoding_buf());
      }
      else
      {
         if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            return false;
      }

      m_block_index++;

#if LZHAM_UPDATE_STATS
      m_stats.print();
#endif

      return true;
   }